

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::WriteBinaryGltfStream(ostream *stream,string *content)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  allocator local_81;
  string local_80 [8];
  string padding;
  int model_format;
  int model_length;
  int length;
  int padding_size;
  int version;
  allocator local_39;
  string local_38 [8];
  string header;
  string *content_local;
  ostream *stream_local;
  
  header.field_2._8_8_ = content;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"glTF",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  length = 2;
  uVar1 = std::__cxx11::string::size();
  model_length = uVar1 & 3;
  iVar2 = std::__cxx11::string::size();
  model_format = iVar2 + 0x14 + model_length;
  lVar3 = std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  std::ostream::write((char *)stream,lVar3);
  std::ostream::write((char *)stream,(long)&length);
  std::ostream::write((char *)stream,(long)&model_format);
  iVar2 = std::__cxx11::string::size();
  padding.field_2._12_4_ = iVar2 + model_length;
  padding.field_2._8_4_ = 0x4e4f534a;
  std::ostream::write((char *)stream,(long)((long)&padding.field_2 + 0xc));
  std::ostream::write((char *)stream,(long)((long)&padding.field_2 + 8));
  lVar3 = std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  std::ostream::write((char *)stream,lVar3);
  if (0 < model_length) {
    uVar4 = (ulong)model_length;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,uVar4,' ',&local_81);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    lVar3 = std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    std::ostream::write((char *)stream,lVar3);
    std::__cxx11::string::~string(local_80);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void WriteBinaryGltfStream(std::ostream &stream,
                                  const std::string &content) {
  const std::string header = "glTF";
  const int version = 2;
  const int padding_size = content.size() % 4;

  // 12 bytes for header, JSON content length, 8 bytes for JSON chunk info,
  // padding
  const int length = 12 + 8 + int(content.size()) + padding_size;

  stream.write(header.c_str(), std::streamsize(header.size()));
  stream.write(reinterpret_cast<const char *>(&version), sizeof(version));
  stream.write(reinterpret_cast<const char *>(&length), sizeof(length));

  // JSON chunk info, then JSON data
  const int model_length = int(content.size()) + padding_size;
  const int model_format = 0x4E4F534A;
  stream.write(reinterpret_cast<const char *>(&model_length),
               sizeof(model_length));
  stream.write(reinterpret_cast<const char *>(&model_format),
               sizeof(model_format));
  stream.write(content.c_str(), std::streamsize(content.size()));

  // Chunk must be multiplies of 4, so pad with spaces
  if (padding_size > 0) {
    const std::string padding = std::string(size_t(padding_size), ' ');
    stream.write(padding.c_str(), std::streamsize(padding.size()));
  }
}